

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  undefined1 *puVar2;
  Cte *pCVar3;
  ExprList_item *pEVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  i16 iVar8;
  uint uVar9;
  Parse *pParse;
  sqlite3 *db;
  VTable *pVVar10;
  sqlite3 *psVar11;
  SrcList *pSVar12;
  With *pWVar13;
  ExprList *pEVar14;
  Schema *pSVar15;
  Column *pCVar16;
  bool bVar17;
  u8 uVar18;
  u32 uVar19;
  int iVar20;
  int iVar21;
  With *pWVar22;
  Table *pTVar23;
  CteUse *pPtr;
  void *pvVar24;
  char *pcVar25;
  Select *pSVar26;
  IdList *pIVar27;
  Expr *pEVar28;
  Expr *pEVar29;
  size_t sVar30;
  ExprList *pEVar31;
  char *pcVar32;
  char *pcVar33;
  Select *pSVar34;
  SrcItem *pSVar35;
  RenameToken *pRVar36;
  long lVar37;
  With *p_1;
  long lVar38;
  ExprList *pEList;
  Schema **ppSVar39;
  SrcList *pSVar40;
  int *piVar41;
  int iVar42;
  ushort uVar43;
  u16 uVar44;
  uint uVar45;
  Select *pSVar46;
  anon_union_8_2_a01b6dbf_for_x *paVar47;
  bool bVar48;
  int iLeft;
  ExprList_item *a;
  char *local_e0;
  uint local_d4;
  int local_c4;
  Expr *local_c0;
  char *local_b8;
  IdList *local_b0;
  uint local_a8;
  int local_a4;
  SrcList *local_a0;
  Token local_98;
  ExprList *local_88;
  ExprList *local_80;
  Expr *local_78;
  ExprList *local_70;
  SrcItem *local_68;
  ExprList_item *local_60;
  int *local_58;
  int *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar9 = p->selFlags;
  p->selFlags = uVar9 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  if ((uVar9 & 0x40) != 0) {
    return 1;
  }
  if (pWalker->eCode != 0) {
    uVar19 = pParse->nSelect + 1;
    pParse->nSelect = uVar19;
    p->selId = uVar19;
  }
  local_80 = p->pEList;
  local_a0 = p->pSrc;
  pWVar22 = p->pWith;
  if ((uVar9 >> 0x15 & 1) == 0 || pParse->pWith == (With *)0x0) {
    if (pWVar22 != (With *)0x0) goto LAB_00190ae5;
  }
  else {
    if (pWVar22 == (With *)0x0) {
      pWVar22 = (With *)sqlite3DbMallocZero(db,0x40);
      p->pWith = pWVar22;
      if (pWVar22 == (With *)0x0) {
        return 2;
      }
    }
    pWVar22->bView = 1;
LAB_00190ae5:
    if (pParse->nErr == 0) {
      pWVar22->pOuter = pParse->pWith;
      pParse->pWith = pWVar22;
    }
  }
  pSVar12 = local_a0;
  sqlite3SrcListAssignCursors(pParse,local_a0);
  pSVar35 = pSVar12->a;
  local_68 = pSVar35;
  if (0 < pSVar12->nSrc) {
    iVar42 = 0;
LAB_00190b39:
    if (pSVar35->pTab == (Table *)0x0) {
      pEVar28 = (Expr *)pSVar35->zName;
      if (pEVar28 == (Expr *)0x0) {
        iVar20 = sqlite3WalkSelect(pWalker,pSVar35->pSelect);
        if (iVar20 != 0) {
          return 2;
        }
        pSVar26 = pSVar35->pSelect;
        pTVar23 = (Table *)sqlite3DbMallocZero(pParse->db,0x68);
        pSVar35->pTab = pTVar23;
        if (pTVar23 == (Table *)0x0) {
          return 2;
        }
        pTVar23->nTabRef = 1;
        if (pSVar35->zAlias == (char *)0x0) {
          pcVar25 = sqlite3MPrintf(pParse->db,"%!S",pSVar35);
        }
        else {
          pcVar25 = sqlite3DbStrDup(pParse->db,pSVar35->zAlias);
        }
        pTVar23->zName = pcVar25;
        do {
          pSVar46 = pSVar26;
          pSVar26 = pSVar46->pPrior;
        } while (pSVar26 != (Select *)0x0);
        sqlite3ColumnsFromExprList
                  ((Parse *)pParse->db,pSVar46->pEList,&pTVar23->nCol,&pTVar23->aCol);
        pTVar23->iPKey = -1;
        pTVar23->nRowLogEst = 200;
        pbVar1 = (byte *)((long)&pTVar23->tabFlags + 1);
        *pbVar1 = *pbVar1 | 0x42;
        if (pParse->nErr != 0) {
          return 2;
        }
      }
      else {
        pWVar22 = pParse->pWith;
        if ((((pWVar22 != (With *)0x0) && (pParse->nErr == 0)) &&
            (pSVar35->zDatabase == (char *)0x0)) &&
           (uVar43 = *(ushort *)&(pSVar35->fg).field_0x1, (uVar43 >> 9 & 1) == 0)) {
          do {
            if (0 < (long)pWVar22->nCte) {
              lVar38 = 0;
LAB_00190b8c:
              pCVar3 = pWVar22->a + lVar38;
              pEVar29 = (Expr *)pWVar22->a[lVar38].zName;
              lVar37 = 0;
              do {
                bVar5 = (&pEVar28->op)[lVar37];
                if (bVar5 == (&pEVar29->op)[lVar37]) {
                  if ((ulong)bVar5 == 0) {
                    pcVar25 = pCVar3->zCteErr;
                    if (pcVar25 != (char *)0x0) goto LAB_00191f96;
                    pEVar29 = pEVar28;
                    if ((uVar43 & 4) != 0) goto LAB_00191f79;
                    psVar11 = pParse->db;
                    pTVar23 = (Table *)sqlite3DbMallocZero(psVar11,0x68);
                    if (pTVar23 == (Table *)0x0) {
                      return 2;
                    }
                    pPtr = pCVar3->pUse;
                    if (pPtr == (CteUse *)0x0) {
                      pPtr = (CteUse *)sqlite3DbMallocZero(psVar11,0x14);
                      pCVar3->pUse = pPtr;
                      if ((pPtr == (CteUse *)0x0) ||
                         (pvVar24 = sqlite3ParserAddCleanup(pParse,sqlite3DbFree,pPtr),
                         pvVar24 == (void *)0x0)) {
                        sqlite3DbFreeNN(psVar11,pTVar23);
                        return 2;
                      }
                      pPtr->eM10d = pCVar3->eM10d;
                    }
                    pSVar35->pTab = pTVar23;
                    pTVar23->nTabRef = 1;
                    pcVar25 = sqlite3DbStrDup(psVar11,pCVar3->zName);
                    pTVar23->zName = pcVar25;
                    pTVar23->iPKey = -1;
                    pTVar23->nRowLogEst = 200;
                    pbVar1 = (byte *)((long)&pTVar23->tabFlags + 1);
                    *pbVar1 = *pbVar1 | 0x42;
                    pSVar26 = sqlite3SelectDup(psVar11,pCVar3->pSelect,0);
                    pSVar35->pSelect = pSVar26;
                    if (psVar11->mallocFailed != '\0') {
                      return 2;
                    }
                    pbVar1 = (byte *)((long)&pSVar26->selFlags + 3);
                    *pbVar1 = *pbVar1 | 4;
                    uVar43 = *(ushort *)&(pSVar35->fg).field_0x1;
                    if ((uVar43 & 2) != 0) {
                      pEVar29 = (Expr *)(pSVar35->u1).zIndexedBy;
                      pcVar25 = "no such index: \"%s\"";
                      goto LAB_00191f96;
                    }
                    *(ushort *)&(pSVar35->fg).field_0x1 = uVar43 | 0x100;
                    (pSVar35->u2).pCteUse = pPtr;
                    iVar20 = pPtr->nUse;
                    pPtr->nUse = iVar20 + 1;
                    if ((0 < iVar20) && (pPtr->eM10d == '\x01')) {
                      pPtr->eM10d = '\0';
                    }
                    bVar5 = pSVar26->op;
                    pSVar46 = pSVar26;
                    if ((bVar5 & 0xfe) != 0x86) goto LAB_00191058;
                    iVar20 = -1;
                    goto LAB_00190f77;
                  }
                }
                else if (""[bVar5] != ""[(&pEVar29->op)[lVar37]]) goto LAB_00190bcc;
                lVar37 = lVar37 + 1;
              } while( true );
            }
LAB_00190bd4:
          } while ((pWVar22->bView == 0) && (pWVar22 = pWVar22->pOuter, pWVar22 != (With *)0x0));
        }
        pTVar23 = sqlite3LocateTableItem(pParse,0,pSVar35);
        pSVar35->pTab = pTVar23;
        if (pTVar23 == (Table *)0x0) {
          return 2;
        }
        if (0xfffe < pTVar23->nTabRef) {
          sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar23->zName);
          pSVar35->pTab = (Table *)0x0;
          return 2;
        }
        pTVar23->nTabRef = pTVar23->nTabRef + 1;
        uVar18 = pTVar23->eTabType;
        if (uVar18 == '\x01') {
          uVar44 = (u16)(byte)pWalker->eCode;
          goto LAB_00190c26;
        }
        if (((pSVar35->fg).field_0x1 & 4) != 0) {
          pEVar29 = (Expr *)pSVar35->zName;
LAB_00191f79:
          pcVar25 = "\'%s\' is not a function";
LAB_00191f96:
          sqlite3ErrorMsg(pParse,pcVar25,pEVar29);
          return 2;
        }
        if (uVar18 != '\0') {
          uVar44 = (u16)(byte)pWalker->eCode;
          if (pTVar23->nCol < 1) {
LAB_00190c26:
            iVar20 = viewGetColumnNames(pParse,pTVar23);
            if (iVar20 != 0) {
              return 2;
            }
            uVar18 = pTVar23->eTabType;
          }
          if (uVar18 == '\x01') {
            if (((((pSVar35->fg).field_0x1 & 0x80) != 0) &&
                (pVVar10 = (pTVar23->u).vtab.p, pVVar10 != (VTable *)0x0)) &&
               (((uint)db->flags >> 7 & 1) < (uint)pVVar10->eVtabRisk)) {
              sqlite3ErrorMsg(pParse,"unsafe use of virtual table \"%s\"",pTVar23->zName);
            }
          }
          else if (uVar18 == '\x02') {
            if (((db->flags & 0x80000000) == 0) && (pTVar23->pSchema != db->aDb[1].pSchema)) {
              sqlite3ErrorMsg(pParse,"access to view \"%s\" prohibited",pTVar23->zName);
            }
            pSVar26 = sqlite3SelectDup(db,(pTVar23->u).view.pSelect,0);
            pSVar35->pSelect = pSVar26;
          }
          iVar8 = pTVar23->nCol;
          pTVar23->nCol = -1;
          pWalker->eCode = 1;
          sqlite3WalkSelect(pWalker,pSVar35->pSelect);
          pWalker->eCode = uVar44;
          pTVar23->nCol = iVar8;
        }
      }
      goto LAB_00190df1;
    }
    goto LAB_00190e0c;
  }
LAB_00191178:
  if (pParse->nErr != 0) {
    return 2;
  }
  pSVar12 = p->pSrc;
  if (1 < pSVar12->nSrc) {
    pSVar35 = pSVar12->a;
    pSVar40 = pSVar12 + 1;
    iVar42 = 0;
    pEVar31 = (ExprList *)pSVar35;
    do {
      pTVar23 = (Table *)pSVar40->a[0].zAlias;
      local_88 = pEVar31;
      if (pTVar23 != (Table *)0x0 && *(Table **)(pEVar31 + 1) != (Table *)0x0) {
        iVar20 = pSVar40->a[0].regReturn;
        uVar19 = ((iVar20 & 0x20) == 0) + 1;
        if ((iVar20 & 4) != 0) {
          if (((pSVar40->a[0].regReturn & 0x40000) != 0) || (*(long *)&pSVar40->a[0].iCursor != 0))
          {
            sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
            return 2;
          }
          if (0 < pTVar23->nCol) {
            lVar38 = 0;
            pIVar27 = (IdList *)0x0;
LAB_00191228:
            do {
              if ((pTVar23->aCol[lVar38].colFlags & 2) == 0) {
                pcVar25 = pTVar23->aCol[lVar38].zCnName;
                iVar20 = tableAndColumnIndex(pSVar12,0,iVar42,pcVar25,(int *)0x0,(int *)0x0,1);
                if (iVar20 != 0) {
                  pIVar27 = sqlite3IdListAppend(pParse,pIVar27,(Token *)0x0);
                  if (pIVar27 == (IdList *)0x0) {
                    lVar38 = lVar38 + 1;
                    pIVar27 = (IdList *)0x0;
                    if (pTVar23->nCol <= lVar38) goto LAB_001912ed;
                    goto LAB_00191228;
                  }
                  pcVar25 = sqlite3DbStrDup(pParse->db,pcVar25);
                  pIVar27->a[(long)pIVar27->nId + -1].zName = pcVar25;
                }
              }
              lVar38 = lVar38 + 1;
            } while (lVar38 < pTVar23->nCol);
            if (pIVar27 != (IdList *)0x0) {
              pbVar1 = (byte *)((long)&pSVar40->a[0].regReturn + 2);
              *pbVar1 = *pbVar1 | 0x14;
              *(IdList **)&pSVar40->a[0].iCursor = pIVar27;
            }
          }
LAB_001912ed:
          if (pParse->nErr != 0) {
            return 2;
          }
        }
        pEVar28 = *(Expr **)&pSVar40->a[0].iCursor;
        if ((pSVar40->a[0].regReturn & 0x40000) == 0) {
          if (pEVar28 != (Expr *)0x0) {
            sqlite3SetJoinExpr(pEVar28,pSVar40->a[0].regResult,uVar19);
            pEVar28 = sqlite3ExprAnd(pParse,p->pWhere,*(Expr **)&pSVar40->a[0].iCursor);
            p->pWhere = pEVar28;
            *(undefined8 *)&pSVar40->a[0].iCursor = 0;
            pbVar1 = (byte *)((long)&pSVar40->a[0].regReturn + 2);
            *pbVar1 = *pbVar1 | 8;
          }
        }
        else {
          iVar20._0_1_ = pEVar28->op;
          iVar20._1_1_ = pEVar28->affExpr;
          iVar20._2_1_ = pEVar28->op2;
          iVar20._3_1_ = pEVar28->field_0x3;
          if (0 < iVar20) {
            psVar11 = pParse->db;
            local_b0 = (IdList *)&pEVar28->u;
            local_a4 = iVar42 + 1;
            lVar38 = 0;
            local_c0 = pEVar28;
            do {
              pEVar29 = *(Expr **)&local_b0->a[lVar38 + -1].u4.idx;
              uVar45 = sqlite3ColumnIndex(pTVar23,(char *)pEVar29);
              if (((int)uVar45 < 0) ||
                 (iVar21 = tableAndColumnIndex(pSVar12,0,iVar42,(char *)pEVar29,(int *)&local_98,
                                               &local_c4,
                                               *(ushort *)((long)&pSVar40->a[0].regReturn + 1) >>
                                               0xc & 1), iVar20 = local_c4, iVar21 == 0)) {
                pcVar25 = "cannot join using column %s - column not present in both tables";
                goto LAB_00191f96;
              }
              pEVar28 = sqlite3CreateColumnExpr(psVar11,pSVar12,(int)local_98.z,local_c4);
              if ((pSVar12->a[(int)local_98.z].fg.field_0x2 & 0x20) != 0) {
                puVar2 = &(pSVar35[(int)local_98.z].pSelect)->pEList->a[iVar20].fg.field_0x1;
                *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
              }
              if (((pSVar12->a[0].fg.jointype & 0x40) != 0) &&
                 (iVar20 = tableAndColumnIndex(pSVar12,(int)local_98.z + 1,iVar42,(char *)pEVar29,
                                               (int *)&local_98,&local_c4,
                                               *(ushort *)((long)&pSVar40->a[0].regReturn + 1) >>
                                               0xc & 1), iVar20 != 0)) {
                local_b8 = (char *)CONCAT44(local_b8._4_4_,uVar45);
                pEVar31 = (ExprList *)0x0;
                do {
                  if (((pSVar12->a[(int)local_98.z].fg.field_0x2 & 4) == 0) ||
                     (iVar20 = sqlite3IdListIndex(pSVar35[(int)local_98.z].u3.pUsing,(char *)pEVar29
                                                 ), iVar20 < 0)) {
                    sqlite3ErrorMsg(pParse,"ambiguous reference to %s in USING()",pEVar29);
                    break;
                  }
                  pEVar31 = sqlite3ExprListAppend(pParse,pEVar31,pEVar28);
                  iVar20 = local_c4;
                  pEVar28 = sqlite3CreateColumnExpr(psVar11,pSVar12,(int)local_98.z,local_c4);
                  if ((pSVar12->a[(int)local_98.z].fg.field_0x2 & 0x20) != 0) {
                    puVar2 = &(pSVar35[(int)local_98.z].pSelect)->pEList->a[iVar20].fg.field_0x1;
                    *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
                  }
                  iVar20 = tableAndColumnIndex(pSVar12,(int)local_98.z + 1,iVar42,(char *)pEVar29,
                                               (int *)&local_98,&local_c4,
                                               *(ushort *)((long)&pSVar40->a[0].regReturn + 1) >>
                                               0xc & 1);
                } while (iVar20 != 0);
                if (pEVar31 != (ExprList *)0x0) {
                  pEVar31 = sqlite3ExprListAppend(pParse,pEVar31,pEVar28);
                  pEVar28 = sqlite3ExprFunction(pParse,pEVar31,
                                                (Token *)sqlite3ProcessJoin_tkCoalesce,0);
                }
                uVar45 = (uint)local_b8;
              }
              pEVar29 = sqlite3CreateColumnExpr(psVar11,pSVar12,local_a4,uVar45);
              if ((pSVar40->a[0].regReturn & 0x200000) != 0) {
                puVar2 = &(pSVar40->a[0].pTab)->pCheck->a[uVar45].fg.field_0x1;
                *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
              }
              pEVar28 = sqlite3PExpr(pParse,0x35,pEVar28,pEVar29);
              if (pEVar28 == (Expr *)0x0) {
                pEVar28 = p->pWhere;
              }
              else {
                pEVar28->flags = pEVar28->flags | uVar19;
                pEVar28->w = (anon_union_4_2_009eaf8f_for_w)pEVar29->iTable;
                pEVar28 = sqlite3ExprAnd(pParse,p->pWhere,pEVar28);
              }
              p->pWhere = pEVar28;
              lVar38 = lVar38 + 1;
              iVar21._0_1_ = local_c0->op;
              iVar21._1_1_ = local_c0->affExpr;
              iVar21._2_1_ = local_c0->op2;
              iVar21._3_1_ = local_c0->field_0x3;
            } while (lVar38 < iVar21);
          }
        }
      }
      iVar42 = iVar42 + 1;
      pSVar40 = (SrcList *)&pSVar40->a[0].u2;
      pEVar31 = (ExprList *)local_88[3].a;
    } while (iVar42 < pSVar12->nSrc + -1);
  }
  if ((long)local_80->nExpr < 1) {
    local_d4 = 0;
  }
  else {
    local_60 = local_80->a;
    lVar38 = 0;
    local_d4 = 0;
    do {
      pcVar25 = *(char **)((long)&local_80->a[0].pExpr + lVar38);
      cVar7 = *pcVar25;
      if (cVar7 == -0x73) {
        cVar7 = **(char **)(pcVar25 + 0x18);
      }
      if (cVar7 == -0x4c) {
        local_38 = (ulong)((uint)pParse->db->flags & 0x44);
        local_50 = &local_a0[1].a[0].iCursor;
        lVar38 = 0;
        pEVar31 = (ExprList *)0x0;
        goto LAB_0019177e;
      }
      local_d4 = local_d4 | *(uint *)(pcVar25 + 4);
      lVar38 = lVar38 + 0x18;
    } while ((long)local_80->nExpr * 0x18 != lVar38);
  }
  pEVar31 = p->pEList;
LAB_00191f31:
  if (pEVar31 == (ExprList *)0x0) {
    return 0;
  }
  if (db->aLimit[2] < pEVar31->nExpr) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
    return 2;
  }
  if ((local_d4 & 0x400008) != 0) {
    pbVar1 = (byte *)((long)&p->selFlags + 2);
    *pbVar1 = *pbVar1 | 4;
    return 0;
  }
  return 0;
LAB_00190bcc:
  lVar38 = lVar38 + 1;
  if (lVar38 == pWVar22->nCte) goto LAB_00190bd4;
  goto LAB_00190b8c;
LAB_00190f77:
  do {
    pSVar12 = pSVar46->pSrc;
    iVar21 = pSVar12->nSrc;
    if (0 < (long)iVar21) {
      lVar38 = 0;
LAB_00190f8d:
      if ((pSVar12->a[lVar38].zDatabase == (char *)0x0) &&
         (pcVar25 = pSVar12->a[lVar38].zName, pcVar25 != (char *)0x0)) {
        lVar37 = 0;
        do {
          bVar6 = pcVar25[lVar37];
          if (bVar6 == pCVar3->zName[lVar37]) {
            if ((ulong)bVar6 == 0) goto LAB_00190fe5;
          }
          else if (""[bVar6] != ""[(byte)pCVar3->zName[lVar37]]) break;
          lVar37 = lVar37 + 1;
        } while( true );
      }
      goto LAB_00190f99;
    }
LAB_00191036:
  } while (((pSVar46->selFlags & 0x2000) != 0) &&
          (pSVar46 = pSVar46->pPrior, pSVar46->op == pSVar26->op));
LAB_00191058:
  pCVar3->zCteErr = "circular reference: %s";
  pWVar13 = pParse->pWith;
  pParse->pWith = pWVar22;
  if ((pSVar26->selFlags & 0x2000) == 0) {
    iVar20 = sqlite3WalkSelect(pWalker,pSVar26);
  }
  else {
    pSVar46->pWith = pSVar26->pWith;
    iVar20 = sqlite3WalkSelect(pWalker,pSVar46);
    pSVar46->pWith = (With *)0x0;
  }
  if (iVar20 != 0) {
    pParse->pWith = pWVar13;
    return 2;
  }
  pParse->pWith = pWVar22;
  pSVar46 = pSVar26;
  do {
    pSVar34 = pSVar46;
    pSVar46 = pSVar34->pPrior;
  } while (pSVar46 != (Select *)0x0);
  pEVar31 = pSVar34->pEList;
  pEVar14 = pCVar3->pCols;
  pEList = pEVar31;
  if (((pEVar14 != (ExprList *)0x0) && (pEList = pEVar14, pEVar31 != (ExprList *)0x0)) &&
     (pEVar31->nExpr != pEVar14->nExpr)) {
    sqlite3ErrorMsg(pParse,"table %s has %d values for %d columns",pCVar3->zName);
    pParse->pWith = pWVar13;
    return 2;
  }
  sqlite3ColumnsFromExprList((Parse *)pParse->db,pEList,&pTVar23->nCol,&pTVar23->aCol);
  if ((bVar5 & 0xfe) == 0x86) {
    pcVar25 = "multiple recursive references: %s";
    if ((pSVar26->selFlags >> 0xd & 1) == 0) {
      pcVar25 = "recursive reference in a subquery: %s";
    }
    pCVar3->zCteErr = pcVar25;
    sqlite3WalkSelect(pWalker,pSVar26);
  }
  pCVar3->zCteErr = (char *)0x0;
  pParse->pWith = pWVar13;
LAB_00190df1:
  if ((((pSVar35->fg).field_0x1 & 2) != 0) &&
     (iVar20 = sqlite3IndexedByLookup(pParse,pSVar35), iVar20 != 0)) {
    return 2;
  }
LAB_00190e0c:
  iVar42 = iVar42 + 1;
  pSVar35 = pSVar35 + 1;
  if (local_a0->nSrc <= iVar42) goto LAB_00191178;
  goto LAB_00190b39;
LAB_00190fe5:
  pSVar12->a[lVar38].pTab = pTVar23;
  pTVar23->nTabRef = pTVar23->nTabRef + 1;
  puVar2 = &pSVar12->a[lVar38].fg.field_0x1;
  *puVar2 = *puVar2 | 0x40;
  if ((pSVar46->selFlags >> 0xd & 1) != 0) {
    pEVar29 = (Expr *)pCVar3->zName;
    pcVar25 = "multiple references to recursive table: %s";
    goto LAB_00191f96;
  }
  pSVar46->selFlags = pSVar46->selFlags | 0x2000;
  if (iVar20 < 0) {
    iVar20 = pParse->nTab;
    pParse->nTab = iVar20 + 1;
  }
  pSVar12->a[lVar38].iCursor = iVar20;
LAB_00190f99:
  lVar38 = lVar38 + 1;
  if (lVar38 == iVar21) goto LAB_00191036;
  goto LAB_00190f8d;
LAB_0019177e:
  do {
    local_78 = local_60[lVar38].pExpr;
    local_d4 = local_d4 | local_78->flags;
    local_48 = lVar38;
    if (local_78->op == 0xb4) {
      pcVar25 = (char *)0x0;
LAB_0019184f:
      iVar42 = local_a0->nSrc;
      if (0 < iVar42) {
        local_c0 = (Expr *)0x0;
        local_58 = local_50;
        bVar17 = false;
        pSVar35 = local_68;
        do {
          local_e0 = pSVar35->zAlias;
          pTVar23 = pSVar35->pTab;
          if (local_e0 == (char *)0x0) {
            local_e0 = pTVar23->zName;
          }
          if (db->mallocFailed != '\0') break;
          if (((pSVar35->fg).field_0x2 & 0x20) == 0) {
            if (pcVar25 != (char *)0x0) {
              lVar38 = 0;
              do {
                bVar5 = pcVar25[lVar38];
                if (bVar5 == local_e0[lVar38]) {
                  if ((ulong)bVar5 == 0) break;
                }
                else if (""[bVar5] != ""[(byte)local_e0[lVar38]]) {
                  uVar45 = (int)local_c0 + 1;
                  goto LAB_00191e83;
                }
                lVar38 = lVar38 + 1;
              } while( true );
            }
            if (pTVar23->pSchema == (Schema *)0x0) {
              local_70 = (ExprList *)0x0;
              local_b8 = "*";
            }
            else {
              uVar45 = 0xffffffff;
              ppSVar39 = &db->aDb->pSchema;
              do {
                uVar45 = uVar45 + 1;
                pSVar15 = *ppSVar39;
                ppSVar39 = ppSVar39 + 4;
              } while (pSVar15 != pTVar23->pSchema);
              local_b8 = db->aDb[uVar45].zDbSName;
              local_70 = (ExprList *)0x0;
            }
          }
          else {
            local_70 = pSVar35->pSelect->pEList;
            local_b8 = (char *)0x0;
          }
          local_a8 = (int)local_c0 + 1;
          if ((int)local_a8 < iVar42) {
            if ((*(byte *)((long)(pSVar35 + 1) + 0x3e) & 4) == 0 || (uVar9 >> 0xb & 1) == 0) {
              pIVar27 = (IdList *)0x0;
            }
            else {
              pIVar27 = *(IdList **)((long)(pSVar35 + 1) + 0x48);
              if (0 < ((anon_union_8_2_443a03b8_for_u *)&pIVar27->nId)->iValue) {
                paVar47 = (anon_union_8_2_a01b6dbf_for_x *)pIVar27->a;
                lVar38 = 0;
                local_b0 = pIVar27;
                do {
                  pEVar28 = (Expr *)paVar47->pList;
                  pEVar29 = sqlite3Expr(db,0x3b,(char *)pEVar28);
                  pEVar31 = sqlite3ExprListAppend(pParse,pEVar31,pEVar29);
                  if (pEVar31 != (ExprList *)0x0) {
                    lVar37 = (long)pEVar31->nExpr;
                    pcVar32 = sqlite3MPrintf(db,"..%s",pEVar28);
                    pEVar31->a[lVar37 + -1].zEName = pcVar32;
                    *(ushort *)&pEVar31->a[lVar37 + -1].fg.field_0x1 =
                         *(ushort *)&pEVar31->a[lVar37 + -1].fg.field_0x1 & 0xff7c | 0x82;
                  }
                  lVar38 = lVar38 + 1;
                  paVar47 = paVar47 + 2;
                  pIVar27 = local_b0;
                } while (lVar38 < ((anon_union_8_2_443a03b8_for_u *)&local_b0->nId)->iValue);
              }
            }
          }
          else {
            pIVar27 = (IdList *)0x0;
          }
          pEVar14 = local_70;
          uVar45 = local_a8;
          if (0 < pTVar23->nCol) {
            bVar48 = local_70 == (ExprList *)0x0;
            uVar45 = (uint)local_c0;
            local_a4 = CONCAT31(local_a4._1_3_,
                                ((uVar9 >> 0xb & 1) == 0 && pcVar25 == (char *)0x0) && uVar45 != 0);
            local_40 = (ulong)~uVar45;
            local_c0 = (Expr *)(ulong)-uVar45;
            lVar38 = 0;
            local_b0 = pIVar27;
            local_88 = pEVar31;
            do {
              pCVar16 = pTVar23->aCol;
              pcVar32 = pCVar16[lVar38].zCnName;
              if ((((bVar48 || pcVar25 == (char *)0x0) ||
                   (iVar42 = sqlite3MatchEName(pEVar14->a + lVar38,(char *)0x0,pcVar25,(char *)0x0),
                   iVar42 != 0)) &&
                  ((uVar43 = pCVar16[lVar38].colFlags, (p->selFlags & 0x20000) != 0 ||
                   ((uVar43 & 2) == 0)))) &&
                 ((((uVar9 >> 0xb & 1) == 0 && pcVar25 == (char *)0x0) & (byte)(uVar43 >> 10) & 1)
                  == 0)) {
                if ((((char)local_a4 == '\0') || (((pSVar35->fg).field_0x2 & 4) == 0)) ||
                   (iVar42 = sqlite3IdListIndex((pSVar35->u3).pUsing,pcVar32), iVar42 < 0)) {
                  pEVar28 = sqlite3Expr(db,0x3b,pcVar32);
                  iVar42 = local_a0->nSrc;
                  if (iVar42 < 2) {
LAB_00191c2e:
                    if (1 < pParse->eParseMode) goto LAB_00191c3c;
                  }
                  else {
                    if (((((pSVar35->fg).jointype & 0x40) != 0) && ((uVar9 & 0x800) == 0)) &&
                       (0 < (int)local_40 + iVar42)) {
                      uVar45 = iVar42 + (int)local_c0;
                      piVar41 = local_58;
                      do {
                        if ((((*piVar41 & 0x4000000000000) != 0) &&
                            (*(IdList **)piVar41 != (IdList *)0x0)) &&
                           (iVar42 = sqlite3IdListIndex(*(IdList **)piVar41,pcVar32), -1 < iVar42))
                        goto LAB_00191c2e;
                        uVar45 = uVar45 - 1;
                        piVar41 = piVar41 + 0x1a;
                      } while (1 < uVar45);
                    }
LAB_00191c3c:
                    pEVar29 = sqlite3Expr(db,0x3b,local_e0);
                    pEVar28 = sqlite3PExpr(pParse,0x8d,pEVar29,pEVar28);
                    if ((1 < pParse->eParseMode) && (local_78->pLeft != (Expr *)0x0)) {
                      for (pRVar36 = pParse->pRename; pRVar36 != (RenameToken *)0x0;
                          pRVar36 = pRVar36->pNext) {
                        if ((Expr *)pRVar36->p == local_78->pLeft) {
                          pRVar36->p = pEVar29;
                          break;
                        }
                      }
                    }
                    if (local_b8 != (char *)0x0) {
                      local_98.z = local_b8;
                      sVar30 = strlen(local_b8);
                      local_98.n = (uint)sVar30 & 0x3fffffff;
                      pEVar29 = sqlite3ExprAlloc(db,0x3b,&local_98,0);
                      pEVar28 = sqlite3PExpr(pParse,0x8d,pEVar29,pEVar28);
                    }
                  }
                  pEVar31 = sqlite3ExprListAppend(pParse,local_88,pEVar28);
                  if (pEVar31 == (ExprList *)0x0) {
                    bVar17 = true;
                    pEVar31 = (ExprList *)0x0;
                    uVar45 = local_a8;
                    break;
                  }
                  lVar37 = (long)pEVar31->nExpr;
                  local_88 = pEVar31;
                  if (((uVar9 >> 0xb & 1) == 0) || (1 < pParse->eParseMode)) {
                    if ((int)local_38 == 4) {
                      pcVar32 = sqlite3MPrintf(db,"%s.%s",local_e0,pcVar32);
                    }
                    else {
                      pcVar32 = sqlite3DbStrDup(db,pcVar32);
                    }
                    pEVar31->a[lVar37 + -1].zEName = pcVar32;
                    puVar2 = &pEVar31->a[lVar37 + -1].fg.field_0x1;
                    *puVar2 = *puVar2 & 0xfc;
                  }
                  else {
                    if (local_70 == (ExprList *)0x0) {
                      pcVar33 = sqlite3MPrintf(db,"%s.%s.%s",local_b8,local_e0,pcVar32);
                    }
                    else {
                      pcVar33 = sqlite3DbStrDup(db,pEVar14->a[lVar38].zEName);
                    }
                    pEVar31->a[lVar37 + -1].zEName = pcVar33;
                    uVar43 = *(ushort *)&pEVar31->a[lVar37 + -1].fg.field_0x1 & 0xfffc;
                    *(ushort *)&pEVar31->a[lVar37 + -1].fg.field_0x1 = uVar43 + 2;
                    if ((((((pSVar35->fg).field_0x2 & 4) != 0) &&
                         (iVar42 = sqlite3IdListIndex((pSVar35->u3).pUsing,pcVar32), -1 < iVar42))
                        || ((local_b0 != (IdList *)0x0 &&
                            (iVar42 = sqlite3IdListIndex(local_b0,pcVar32), -1 < iVar42)))) ||
                       ((pTVar23->aCol[lVar38].colFlags & 0x400) != 0)) {
                      *(ushort *)&pEVar31->a[lVar37 + -1].fg.field_0x1 = uVar43 | 0x102;
                    }
                  }
                }
                bVar17 = true;
              }
              lVar38 = lVar38 + 1;
              pEVar31 = local_88;
              uVar45 = local_a8;
            } while (lVar38 < pTVar23->nCol);
          }
LAB_00191e83:
          pSVar35 = pSVar35 + 1;
          iVar42 = local_a0->nSrc;
          local_58 = local_58 + 0x1a;
          local_c0 = (Expr *)(ulong)uVar45;
        } while ((int)uVar45 < iVar42);
        if (bVar17) goto LAB_00191efb;
      }
      if (pcVar25 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified");
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s");
      }
    }
    else {
      if ((local_78->op == 0x8d) && (local_78->pRight->op == 0xb4)) {
        pcVar25 = (local_78->pLeft->u).zToken;
        goto LAB_0019184f;
      }
      pEVar4 = local_60 + lVar38;
      pEVar31 = sqlite3ExprListAppend(pParse,pEVar31,local_78);
      if (pEVar31 != (ExprList *)0x0) {
        lVar38 = (long)pEVar31->nExpr;
        pEVar31->a[lVar38 + -1].zEName = pEVar4->zEName;
        *(ushort *)&pEVar31->a[lVar38 + -1].fg.field_0x1 =
             *(ushort *)&pEVar31->a[lVar38 + -1].fg.field_0x1 & 0xfffc |
             *(ushort *)&(pEVar4->fg).field_0x1 & 3;
        pEVar4->zEName = (char *)0x0;
      }
      pEVar4->pExpr = (Expr *)0x0;
    }
LAB_00191efb:
    lVar38 = local_48 + 1;
  } while (lVar38 < local_80->nExpr);
  exprListDeleteNN(db,local_80);
  p->pEList = pEVar31;
  goto LAB_00191f31;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k, rc;
  SrcList *pTabList;
  ExprList *pEList;
  SrcItem *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  if( pWalker->eCode ){
    /* Renumber selId because it has been copied from a view */
    p->selId = ++pParse->nSelect;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( pParse->pWith && (p->selFlags & SF_View) ){
    if( p->pWith==0 ){
      p->pWith = (With*)sqlite3DbMallocZero(db, sizeof(With));
      if( p->pWith==0 ){
        return WRC_Abort;
      }
    }
    p->pWith->bView = 1;
  }
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->pTab ) continue;
    assert( pFrom->fg.isRecursive==0 );
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
#ifndef SQLITE_OMIT_CTE
    }else if( (rc = resolveFromTermToCte(pParse, pWalker, pFrom))!=0 ){
      if( rc>1 ) return WRC_Abort;
      pTab = pFrom->pTab;
      assert( pTab!=0 );
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
      if( !IsOrdinaryTable(pTab) ){
        i16 nCol;
        u8 eCodeOrig = pWalker->eCode;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        if( IsView(pTab) ){
          if( (db->flags & SQLITE_EnableView)==0
           && pTab->pSchema!=db->aDb[1].pSchema
          ){
            sqlite3ErrorMsg(pParse, "access to view \"%s\" prohibited",
              pTab->zName);
          }
          pFrom->pSelect = sqlite3SelectDup(db, pTab->u.view.pSelect, 0);
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        else if( ALWAYS(IsVirtual(pTab))
         && pFrom->fg.fromDDL
         && ALWAYS(pTab->u.vtab.p!=0)
         && pTab->u.vtab.p->eVtabRisk > ((db->flags & SQLITE_TrustedSchema)!=0)
        ){
          sqlite3ErrorMsg(pParse, "unsafe use of virtual table \"%s\"",
                                  pTab->zName);
        }
        assert( SQLITE_VTABRISK_Normal==1 && SQLITE_VTABRISK_High==2 );
#endif
        nCol = pTab->nCol;
        pTab->nCol = -1;
        pWalker->eCode = 1;  /* Turn on Select.selId renumbering */
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pWalker->eCode = eCodeOrig;
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( pFrom->fg.isIndexedBy && sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  assert( db->mallocFailed==0 || pParse->nErr!=0 );
  if( pParse->nErr || sqlite3ProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zEName = a[k].zEName;
          pNew->a[pNew->nExpr-1].fg.eEName = a[k].fg.eEName;
          a[k].zEName = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;   /* Table for this data source */
          ExprList *pNestedFrom;       /* Result-set of a nested FROM clause */
          char *zTabName;              /* AS name for this data source */
          const char *zSchemaName = 0; /* Schema name for this data source */
          int iDb;                     /* Schema index for this data src */
          IdList *pUsing;              /* USING clause for pFrom[1] */

          if( (zTabName = pFrom->zAlias)==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          assert( (int)pFrom->fg.isNestedFrom == IsNestedFrom(pFrom->pSelect) );
          if( pFrom->fg.isNestedFrom ){
            assert( pFrom->pSelect!=0 );
            pNestedFrom = pFrom->pSelect->pEList;
            assert( pNestedFrom!=0 );
            assert( pNestedFrom->nExpr==pTab->nCol );
          }else{
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            pNestedFrom = 0;
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          if( i+1<pTabList->nSrc
           && pFrom[1].fg.isUsing
           && (selFlags & SF_NestedFrom)!=0
          ){
            int ii;
            pUsing = pFrom[1].u3.pUsing;
            for(ii=0; ii<pUsing->nId; ii++){
              const char *zUName = pUsing->a[ii].zName;
              pRight = sqlite3Expr(db, TK_ID, zUName);
              pNew = sqlite3ExprListAppend(pParse, pNew, pRight);
              if( pNew ){
                struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
                assert( pX->zEName==0 );
                pX->zEName = sqlite3MPrintf(db,"..%s", zUName);
                pX->fg.eEName = ENAME_TAB;
                pX->fg.bUsingTerm = 1;
              }
            }
          }else{
            pUsing = 0;
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zCnName;
            struct ExprList_item *pX; /* Newly added ExprList term */

            assert( zName );
            if( zTName
             && pNestedFrom
             && sqlite3MatchEName(&pNestedFrom->a[j], 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j])
            ){
              continue;
            }
            if( (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
             && zTName==0
             && (selFlags & (SF_NestedFrom))==0
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 && (selFlags & SF_NestedFrom)==0 ){
              if( pFrom->fg.isUsing
               && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0
              ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            if( (pTabList->nSrc>1
                 && (  (pFrom->fg.jointype & JT_LTORJ)==0
                     || (selFlags & SF_NestedFrom)!=0
                     || !inAnyUsingClause(zName,pFrom,pTabList->nSrc-i-1)
                    )
                )
             || IN_RENAME_OBJECT
            ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( IN_RENAME_OBJECT && pE->pLeft ){
                sqlite3RenameTokenRemap(pParse, pLeft, pE->pLeft);
              }
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            if( pNew==0 ){
              break;  /* OOM */
            }
            pX = &pNew->a[pNew->nExpr-1];
            assert( pX->zEName==0 );
            if( (selFlags & SF_NestedFrom)!=0 && !IN_RENAME_OBJECT ){
              if( pNestedFrom ){
                pX->zEName = sqlite3DbStrDup(db, pNestedFrom->a[j].zEName);
                testcase( pX->zEName==0 );
              }else{
                pX->zEName = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zName);
                testcase( pX->zEName==0 );
              }
              pX->fg.eEName = ENAME_TAB;
              if( (pFrom->fg.isUsing
                   && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0)
               || (pUsing && sqlite3IdListIndex(pUsing, zName)>=0)
               || (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
              ){
                pX->fg.bNoExpand = 1;
              }
            }else if( longNames ){
              pX->zEName = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
              pX->fg.eEName = ENAME_NAME;
            }else{
              pX->zEName = sqlite3DbStrDup(db, zName);
              pX->fg.eEName = ENAME_NAME;
            }
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x100 ){
    SELECTTRACE(0x100,pParse,p,("After result-set wildcard expansion:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif
  return WRC_Continue;
}